

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O0

DOMAttrMapImpl * __thiscall
xercesc_4_0::DOMAttrMapImpl::cloneAttrMap(DOMAttrMapImpl *this,DOMNode *ownerNode_p)

{
  DOMNodeImpl *this_00;
  DOMDocument *doc;
  DOMAttrMapImpl *this_01;
  DOMAttrMapImpl *newmap;
  DOMNode *ownerNode_p_local;
  DOMAttrMapImpl *this_local;
  
  this_00 = xercesc_4_0::castToNodeImpl(ownerNode_p);
  doc = DOMNodeImpl::getOwnerDocument(this_00);
  this_01 = (DOMAttrMapImpl *)operator_new(0x20,doc);
  DOMAttrMapImpl(this_01,ownerNode_p);
  (*(this_01->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[10])(this_01,this);
  return this_01;
}

Assistant:

DOMAttrMapImpl *DOMAttrMapImpl::cloneAttrMap(DOMNode *ownerNode_p)
{
	DOMAttrMapImpl *newmap = new (castToNodeImpl(ownerNode_p)->getOwnerDocument()) DOMAttrMapImpl(ownerNode_p);
	newmap->cloneContent(this);
	// newmap->attrDefaults = this->attrDefaults;  // revisit
	return newmap;
}